

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.h
# Opt level: O2

btTransform * __thiscall btSoftBody::Body::xform(Body *this)

{
  int iVar1;
  btTransform *pbVar2;
  
  if (xform()::identity == '\0') {
    iVar1 = __cxa_guard_acquire(&xform()::identity);
    if (iVar1 != 0) {
      pbVar2 = btTransform::getIdentity();
      xform::identity.m_basis.m_el[0].m_floats = *&(pbVar2->m_basis).m_el[0].m_floats;
      xform::identity.m_basis.m_el[1].m_floats = *&(pbVar2->m_basis).m_el[1].m_floats;
      xform::identity.m_basis.m_el[2].m_floats = *&(pbVar2->m_basis).m_el[2].m_floats;
      xform::identity.m_origin.m_floats = *&(pbVar2->m_origin).m_floats;
      __cxa_guard_release(&xform()::identity);
    }
  }
  pbVar2 = &xform::identity;
  if (this->m_soft != (Cluster *)0x0) {
    pbVar2 = &this->m_soft->m_framexform;
  }
  if (this->m_collisionObject != (btCollisionObject *)0x0) {
    pbVar2 = &this->m_collisionObject->m_worldTransform;
  }
  return pbVar2;
}

Assistant:

const btTransform&			xform() const
		{
			static const btTransform	identity=btTransform::getIdentity();		
			if(m_collisionObject) return(m_collisionObject->getWorldTransform());
			if(m_soft)	return(m_soft->m_framexform);
			return(identity);
		}